

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_dual.cpp
# Opt level: O2

void __thiscall cppcms::sessions::session_dual::clear(session_dual *this,session_interface *session)

{
  element_type *peVar1;
  element_type *peVar2;
  string cookie;
  string local_38;
  
  session_interface::get_session_cookie_abi_cxx11_(&local_38,session);
  if ((local_38._M_string_length == 0) || (*local_38._M_dataplus._M_p != 'C')) {
    peVar2 = (this->server_).
             super___shared_ptr<cppcms::sessions::session_sid,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar2->super_session_api)._vptr_session_api[2])(peVar2,session);
  }
  else {
    peVar1 = (this->client_).
             super___shared_ptr<cppcms::sessions::session_cookies,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*(peVar1->super_session_api)._vptr_session_api[2])(peVar1,session);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void session_dual::clear(session_interface &session)
{
	std::string cookie = session.get_session_cookie();
	if(!cookie.empty() && cookie[0]=='C') {
		client_->clear(session);
	}
	else {
		server_->clear(session);
	}
}